

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingScanPartial<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  BitpackingMode BVar1;
  byte width;
  data_ptr_t pdVar2;
  idx_t iVar3;
  uint64_t uVar4;
  BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t> *this;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uhugeint_t *out;
  ulong uVar8;
  BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t> *pBVar9;
  uint uVar10;
  int64_t *piVar11;
  idx_t iVar12;
  hugeint_t hVar13;
  hugeint_t frame_of_reference;
  hugeint_t previous_value;
  uhugeint_t local_80;
  uhugeint_t local_70;
  uhugeint_t local_60;
  uhugeint_t local_50;
  uhugeint_t local_40;
  
  this = (BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar2 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (scan_count != 0) {
    lVar7 = result_offset * 0x10;
    iVar12 = 0;
    do {
      if (this->current_group_offset == 0x800) {
        BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t>::LoadNextGroup(this);
      }
      iVar3 = this->current_group_offset;
      BVar1 = (this->current_group).mode;
      uVar6 = scan_count - iVar12;
      if (BVar1 == CONSTANT_DELTA) {
        uVar8 = 0x800 - iVar3;
        if (uVar6 < 0x800 - iVar3) {
          uVar8 = uVar6;
        }
        if (uVar8 != 0) {
          piVar11 = (int64_t *)(pdVar2 + iVar12 * 0x10 + lVar7 + 8);
          uVar6 = 0;
          do {
            iVar3 = this->current_group_offset;
            local_70 = hugeint_t::operator_cast_to_uhugeint_t(&this->current_constant);
            uhugeint_t::uhugeint_t(&local_40,iVar3 + uVar6);
            local_60 = uhugeint_t::operator*(&local_70,&local_40);
            local_80 = hugeint_t::operator_cast_to_uhugeint_t(&this->current_frame_of_reference);
            local_50 = uhugeint_t::operator+(&local_60,&local_80);
            hVar13 = uhugeint_t::operator_cast_to_hugeint_t(&local_50);
            piVar11[-1] = hVar13.lower;
            *piVar11 = hVar13.upper;
            uVar6 = uVar6 + 1;
            piVar11 = piVar11 + 2;
          } while (uVar8 != uVar6);
        }
      }
      else if (BVar1 == CONSTANT) {
        uVar8 = 0x800 - iVar3;
        if (uVar6 < 0x800 - iVar3) {
          uVar8 = uVar6;
        }
        if (scan_count != iVar12) {
          lVar5 = iVar12 << 4;
          do {
            uVar4 = (this->current_constant).upper;
            *(uint64_t *)(pdVar2 + lVar5 + lVar7) = (this->current_constant).lower;
            *(uint64_t *)((long)(pdVar2 + lVar5 + lVar7) + 8) = uVar4;
            lVar5 = lVar5 + 0x10;
          } while (scan_count << 4 != lVar5);
        }
      }
      else {
        uVar10 = (uint)iVar3 & 0x1f;
        uVar8 = 0x20 - (ulong)uVar10;
        if (uVar6 < uVar8) {
          uVar8 = uVar6;
        }
        width = this->current_width;
        out = (uhugeint_t *)(pdVar2 + iVar12 * 0x10 + lVar7);
        pBVar9 = this;
        if ((uVar8 == 0x20) && ((ulong)uVar10 == 0)) {
          HugeIntPacker::Unpack
                    ((uint32_t *)
                     (this->current_group_ptr +
                     ((width * iVar3 >> 3) - (ulong)(width * uVar10 >> 3))),out,width);
        }
        else {
          HugeIntPacker::Unpack
                    ((uint32_t *)
                     (this->current_group_ptr +
                     ((width * iVar3 >> 3) - (ulong)(width * uVar10 >> 3))),
                     (uhugeint_t *)this->decompression_buffer,width);
          switchD_012dd528::default
                    (out,(void *)((long)&this->decompression_buffer[0].lower + (ulong)(uVar10 << 4))
                     ,uVar8 << 4);
        }
        if ((this->current_group).mode == DELTA_FOR) {
          frame_of_reference.upper = uVar8;
          frame_of_reference.lower = (this->current_frame_of_reference).upper;
          ApplyFrameOfReference<duckdb::hugeint_t>
                    ((duckdb *)out,(hugeint_t *)(this->current_frame_of_reference).lower,
                     frame_of_reference,(idx_t)pBVar9);
          previous_value.upper = uVar8;
          previous_value.lower = (this->current_delta_offset).upper;
          DeltaDecode<duckdb::hugeint_t>
                    ((duckdb *)out,(hugeint_t *)(this->current_delta_offset).lower,previous_value,
                     (size_t)pBVar9);
          uVar4 = out[uVar8 - 1].upper;
          (this->current_delta_offset).lower = out[uVar8 - 1].lower;
          (this->current_delta_offset).upper = uVar4;
        }
        else {
          hVar13.upper = uVar8;
          hVar13.lower = (this->current_frame_of_reference).upper;
          ApplyFrameOfReference<duckdb::hugeint_t>
                    ((duckdb *)out,(hugeint_t *)(this->current_frame_of_reference).lower,hVar13,
                     (idx_t)pBVar9);
        }
      }
      this->current_group_offset = this->current_group_offset + uVar8;
      iVar12 = iVar12 + uVar8;
    } while (iVar12 < scan_count);
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}